

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRadiusDimension::IfcRadiusDimension(IfcRadiusDimension *this)

{
  IfcRadiusDimension *this_local;
  
  STEP::Object::Object
            ((Object *)&(this->super_IfcDimensionCurveDirectedCallout).field_0x68,
             "IfcRadiusDimension");
  IfcDimensionCurveDirectedCallout::IfcDimensionCurveDirectedCallout
            (&this->super_IfcDimensionCurveDirectedCallout,&PTR_construction_vtable_24__0107da20);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRadiusDimension,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcRadiusDimension,_0UL> *)
             &(this->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.field_0x58,
             &PTR_construction_vtable_24__0107dad0);
  (this->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.
  super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x107d940;
  *(undefined8 *)&(this->super_IfcDimensionCurveDirectedCallout).field_0x68 = 0x107da08;
  *(undefined8 *)
   &(this->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.
    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x107d968;
  *(undefined8 *)
   &(this->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.
    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x107d990;
  *(undefined8 *)
   &(this->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.field_0x48 = 0x107d9b8
  ;
  *(undefined8 *)
   &(this->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.field_0x58 = 0x107d9e0
  ;
  return;
}

Assistant:

IfcRadiusDimension() : Object("IfcRadiusDimension") {}